

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

bool __thiscall
libchars::command_cursor::command(command_cursor *this,filter_t mask,bool ignore_hidden)

{
  bool bVar1;
  command_node *pcVar2;
  
  bVar1 = valid(this);
  if ((((bVar1) && (pcVar2 = current(this), (pcVar2->mask & mask) != 0)) &&
      (pcVar2 = current(this), (byte)(pcVar2->hidden ^ 1U | ignore_hidden) == 1)) &&
     ((pcVar2 = current(this), pcVar2->cmd != (command *)0x0 &&
      (pcVar2 = current(this), (pcVar2->cmd->mask & mask) != 0)))) {
    pcVar2 = current(this);
    return (bool)(pcVar2->cmd->hidden ^ 1U | ignore_hidden);
  }
  return false;
}

Assistant:

bool command_cursor::command(command::filter_t mask, bool ignore_hidden) const
    {
        return valid() &&
               (current()->mask & mask) != 0 &&
               (!current()->hidden || ignore_hidden) &&
               current()->cmd != NULL &&
               (current()->cmd->mask & mask) != 0 &&
               (!current()->cmd->hidden || ignore_hidden);
    }